

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatSanitizeForScanning(char *fmt_in,char *fmt_out,size_t fmt_out_size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  char c;
  bool has_type;
  char *fmt_out_begin;
  char *fmt_end;
  bool local_2c;
  char *local_10;
  char *local_8;
  
  pcVar2 = ImParseFormatFindEnd(in_RDI);
  bVar4 = false;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_8 < pcVar2) {
    pcVar3 = local_8 + 1;
    cVar1 = *local_8;
    local_8 = pcVar3;
    if ((bVar4) ||
       ((((cVar1 < '0' || ('9' < cVar1)) && (cVar1 != '.')) && ((cVar1 != '+' && (cVar1 != '#'))))))
    {
      if ((cVar1 < 'a') || (local_2c = true, 'z' < cVar1)) {
        local_2c = '@' < cVar1 && cVar1 < '[';
      }
      bVar4 = bVar4 || local_2c;
      if (((cVar1 != '\'') && (cVar1 != '$')) && (cVar1 != '_')) {
        *local_10 = cVar1;
        local_10 = local_10 + 1;
      }
    }
  }
  *local_10 = '\0';
  return in_RSI;
}

Assistant:

const char* ImParseFormatSanitizeForScanning(const char* fmt_in, char* fmt_out, size_t fmt_out_size)
{
    const char* fmt_end = ImParseFormatFindEnd(fmt_in);
    const char* fmt_out_begin = fmt_out;
    IM_UNUSED(fmt_out_size);
    IM_ASSERT((size_t)(fmt_end - fmt_in + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    bool has_type = false;
    while (fmt_in < fmt_end)
    {
        char c = *fmt_in++;
        if (!has_type && ((c >= '0' && c <= '9') || c == '.' || c == '+' || c == '#'))
            continue;
        has_type |= ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z')); // Stop skipping digits
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
    return fmt_out_begin;
}